

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::FeatureDescription::SerializeWithCachedSizes
          (FeatureDescription *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  psVar1 = (this->name_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.FeatureDescription.name");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output)
    ;
  }
  psVar1 = (this->shortdescription_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.FeatureDescription.shortDescription");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (2,(this->shortdescription_).ptr_,output);
  }
  if (this->type_ != (FeatureType *)0x0 &&
      this != (FeatureDescription *)&_FeatureDescription_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->type_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void FeatureDescription::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FeatureDescription)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string name = 1;
  if (this->name().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.FeatureDescription.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // string shortDescription = 2;
  if (this->shortdescription().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->shortdescription().data(), this->shortdescription().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.FeatureDescription.shortDescription");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->shortdescription(), output);
  }

  // .CoreML.Specification.FeatureType type = 3;
  if (this->has_type()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->type_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FeatureDescription)
}